

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_prefix_coding.cpp
# Opt level: O3

bool crnlib::prefix_coding::generate_decoder_tables
               (uint num_syms,uint8 *pCodesizes,decoder_tables *pTables,uint table_bits)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  ushort uVar4;
  uint16 *puVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  uint i;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  void *pvVar12;
  uint *puVar13;
  byte bVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint32 *puVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint num_codes [17];
  uint min_codes [16];
  uint sorted_positions [17];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  uint auStack_bc [35];
  
  bVar8 = table_bits < 0xc && num_syms != 0;
  if (table_bits >= 0xc || num_syms == 0) {
    return bVar8;
  }
  pTables->m_num_syms = num_syms;
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_c8 = 0;
  uVar10 = 0;
  do {
    if ((ulong)pCodesizes[uVar10] != 0) {
      *(int *)(local_108 + (ulong)pCodesizes[uVar10] * 4) =
           *(int *)(local_108 + (ulong)pCodesizes[uVar10] * 4) + 1;
    }
    uVar10 = uVar10 + 1;
  } while (num_syms != uVar10);
  uVar9 = 0xffffffff;
  lVar11 = 0;
  bVar14 = 0xf;
  uVar16 = 0;
  uVar18 = 0;
  uVar23 = 0;
  do {
    iVar22 = *(int *)(local_108 + lVar11 * 4 + 4);
    if (iVar22 == 0) {
      pTables->m_max_codes[lVar11] = 0;
    }
    else {
      uVar21 = (int)lVar11 + 1;
      if (uVar21 <= uVar9) {
        uVar9 = uVar21;
      }
      if (uVar23 <= uVar21) {
        uVar23 = uVar21;
      }
      iVar1 = iVar22 + uVar16;
      auStack_bc[lVar11 + 1] = uVar16;
      uVar16 = uVar16 + iVar22;
      pTables->m_max_codes[lVar11] = (~(-1 << (bVar14 & 0x1f)) | iVar1 + -1 << (bVar14 & 0x1f)) + 1;
      pTables->m_val_ptrs[lVar11] = uVar18;
      auStack_bc[lVar11 + 0x12] = uVar18;
      uVar18 = iVar22 + uVar18;
    }
    uVar16 = uVar16 * 2;
    bVar14 = bVar14 - 1;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x10);
  pTables->m_total_used_syms = uVar18;
  if (pTables->m_cur_sorted_symbol_order_size < uVar18) {
    uVar16 = uVar18 - 1;
    if (((uVar18 & uVar16) != 0) &&
       (uVar16 = uVar16 >> 0x10 | uVar16, uVar16 = uVar16 >> 8 | uVar16,
       uVar16 = uVar16 >> 4 | uVar16, uVar16 = uVar16 >> 2 | uVar16,
       uVar18 = (uVar16 >> 1 | uVar16) + 1, num_syms < uVar18)) {
      uVar18 = num_syms;
    }
    pTables->m_cur_sorted_symbol_order_size = uVar18;
    puVar5 = pTables->m_sorted_symbol_order;
    if (puVar5 != (uint16 *)0x0) {
      if ((*(uint *)(puVar5 + -4) ^ *(uint *)(puVar5 + -2)) == 0xffffffff) {
        crnlib_free(puVar5 + -8);
        uVar18 = pTables->m_cur_sorted_symbol_order_size;
      }
      pTables->m_sorted_symbol_order = (uint16 *)0x0;
    }
    uVar16 = uVar18 + (uVar18 == 0);
    pvVar12 = crnlib_malloc((ulong)uVar16 * 2 + 0x10);
    *(uint *)((long)pvVar12 + 0xc) = uVar16;
    *(uint *)((long)pvVar12 + 8) = ~uVar16;
    pTables->m_sorted_symbol_order = (uint16 *)((long)pvVar12 + 0x10);
  }
  pTables->m_min_code_size = (uint8)uVar9;
  pTables->m_max_code_size = (uint8)uVar23;
  uVar10 = 0;
  do {
    uVar15 = (ulong)pCodesizes[uVar10];
    if (uVar15 != 0) {
      uVar16 = auStack_bc[uVar15 + 0x11];
      auStack_bc[uVar15 + 0x11] = uVar16 + 1;
      pTables->m_sorted_symbol_order[uVar16] = (uint16)uVar10;
    }
    uVar10 = uVar10 + 1;
  } while (num_syms != uVar10);
  uVar9 = (uint)pTables->m_min_code_size;
  uVar16 = 0;
  if (uVar9 < table_bits) {
    uVar16 = table_bits;
  }
  pTables->m_table_bits = uVar16;
  if (uVar9 < table_bits) {
    bVar14 = (byte)table_bits;
    uVar21 = 1 << (bVar14 & 0x1f);
    if (pTables->m_cur_lookup_size < uVar21) {
      pTables->m_cur_lookup_size = uVar21;
      puVar20 = pTables->m_lookup;
      if (puVar20 != (uint32 *)0x0) {
        if ((puVar20[-2] ^ puVar20[-1]) == 0xffffffff) {
          crnlib_free(puVar20 + -4);
        }
        pTables->m_lookup = (uint32 *)0x0;
      }
      pvVar12 = crnlib_malloc((ulong)((4 << (bVar14 & 0x1f)) + 0x10));
      puVar20 = (uint32 *)((long)pvVar12 + 0x10);
      *(uint *)((long)pvVar12 + 0xc) = uVar21;
      *(uint *)((long)pvVar12 + 8) = ~uVar21;
      pTables->m_lookup = puVar20;
    }
    else {
      puVar20 = pTables->m_lookup;
    }
    memset(puVar20,0xff,4L << (bVar14 & 0x3f));
    uVar10 = 1;
    do {
      if (*(int *)(local_108 + uVar10 * 4) != 0) {
        uVar18 = pTables->m_max_codes[uVar10 - 1];
        uVar19 = uVar18 - 1 >> (0x10U - (char)uVar10 & 0x1f);
        uVar21 = auStack_bc[uVar10];
        if ((uVar18 == 0) || (uVar21 <= uVar19)) {
          iVar22 = pTables->m_max_codes[uVar10 + 0x10] - uVar21;
          bVar14 = (char)uVar16 - (char)uVar10;
          do {
            uVar4 = pTables->m_sorted_symbol_order[iVar22 + uVar21];
            uVar17 = 1;
            do {
              pTables->m_lookup[((uVar21 << (bVar14 & 0x1f)) + uVar17) - 1] =
                   (uint)uVar4 | (int)uVar10 << 0x10;
              uVar6 = uVar17 >> (bVar14 & 0x1f);
              uVar17 = uVar17 + 1;
            } while (uVar6 == 0);
            uVar21 = uVar21 + 1;
          } while ((uVar18 == 0) || (uVar21 <= uVar19));
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != table_bits + 1);
  }
  lVar11 = 0;
  do {
    piVar2 = pTables->m_val_ptrs + lVar11;
    iVar22 = piVar2[1];
    iVar1 = piVar2[2];
    iVar7 = piVar2[3];
    uVar21 = auStack_bc[lVar11 + 2];
    uVar19 = auStack_bc[lVar11 + 3];
    uVar17 = auStack_bc[lVar11 + 4];
    piVar3 = pTables->m_val_ptrs + lVar11;
    *piVar3 = *piVar2 - auStack_bc[lVar11 + 1];
    piVar3[1] = iVar22 - uVar21;
    piVar3[2] = iVar1 - uVar19;
    piVar3[3] = iVar7 - uVar17;
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x10);
  pTables->m_table_max_code = 0;
  pTables->m_decode_start_code_size = (uint)pTables->m_min_code_size;
  if (uVar9 < table_bits) {
    puVar13 = pTables->m_max_codes + (table_bits - 1);
    do {
      if (*(int *)(local_108 + (ulong)table_bits * 4) != 0) {
        pTables->m_table_max_code = *puVar13;
        uVar9 = uVar16 + 1;
        pTables->m_decode_start_code_size = uVar9;
        if (uVar16 < uVar23) goto LAB_0019e023;
        break;
      }
      table_bits = table_bits - 1;
      puVar13 = puVar13 + -1;
    } while (table_bits != 0);
  }
  goto LAB_0019e037;
  while (uVar9 = uVar9 + 1, uVar9 <= uVar23) {
LAB_0019e023:
    if (*(int *)(local_108 + (ulong)uVar9 * 4) != 0) {
      pTables->m_decode_start_code_size = uVar9;
      break;
    }
  }
LAB_0019e037:
  pTables->m_max_codes[0x10] = 0xffffffff;
  pTables->m_val_ptrs[0x10] = 0xfffff;
  pTables->m_table_shift = 0x20 - pTables->m_table_bits;
  return bVar8;
}

Assistant:

bool generate_decoder_tables(uint num_syms, const uint8* pCodesizes, decoder_tables* pTables, uint table_bits) {
  uint min_codes[cMaxExpectedCodeSize];

  if ((!num_syms) || (table_bits > cMaxTableBits))
    return false;

  pTables->m_num_syms = num_syms;

  uint num_codes[cMaxExpectedCodeSize + 1];
  utils::zero_object(num_codes);

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c)
      num_codes[c]++;
  }

  uint sorted_positions[cMaxExpectedCodeSize + 1];

  uint code = 0;

  uint total_used_syms = 0;
  uint max_code_size = 0;
  uint min_code_size = UINT_MAX;
  for (uint i = 1; i <= cMaxExpectedCodeSize; i++) {
    const uint n = num_codes[i];

    if (!n)
      pTables->m_max_codes[i - 1] = 0;  //UINT_MAX;
    else {
      min_code_size = math::minimum(min_code_size, i);
      max_code_size = math::maximum(max_code_size, i);

      min_codes[i - 1] = code;

      pTables->m_max_codes[i - 1] = code + n - 1;
      pTables->m_max_codes[i - 1] = 1 + ((pTables->m_max_codes[i - 1] << (16 - i)) | ((1 << (16 - i)) - 1));

      pTables->m_val_ptrs[i - 1] = total_used_syms;

      sorted_positions[i] = total_used_syms;

      code += n;
      total_used_syms += n;
    }

    code <<= 1;
  }

  pTables->m_total_used_syms = total_used_syms;

  if (total_used_syms > pTables->m_cur_sorted_symbol_order_size) {
    pTables->m_cur_sorted_symbol_order_size = total_used_syms;

    if (!math::is_power_of_2(total_used_syms))
      pTables->m_cur_sorted_symbol_order_size = math::minimum<uint>(num_syms, math::next_pow2(total_used_syms));

    if (pTables->m_sorted_symbol_order) {
      crnlib_delete_array(pTables->m_sorted_symbol_order);
      pTables->m_sorted_symbol_order = NULL;
    }

    pTables->m_sorted_symbol_order = crnlib_new_array<uint16>(pTables->m_cur_sorted_symbol_order_size);
  }

  pTables->m_min_code_size = static_cast<uint8>(min_code_size);
  pTables->m_max_code_size = static_cast<uint8>(max_code_size);

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c) {
      CRNLIB_ASSERT(num_codes[c]);

      uint sorted_pos = sorted_positions[c]++;

      CRNLIB_ASSERT(sorted_pos < total_used_syms);

      pTables->m_sorted_symbol_order[sorted_pos] = static_cast<uint16>(i);
    }
  }

  if (table_bits <= pTables->m_min_code_size)
    table_bits = 0;
  pTables->m_table_bits = table_bits;

  if (table_bits) {
    uint table_size = 1 << table_bits;
    if (table_size > pTables->m_cur_lookup_size) {
      pTables->m_cur_lookup_size = table_size;

      if (pTables->m_lookup) {
        crnlib_delete_array(pTables->m_lookup);
        pTables->m_lookup = NULL;
      }

      pTables->m_lookup = crnlib_new_array<uint32>(table_size);
    }

    memset(pTables->m_lookup, 0xFF, static_cast<uint>(sizeof(pTables->m_lookup[0])) * (1UL << table_bits));

    for (uint codesize = 1; codesize <= table_bits; codesize++) {
      if (!num_codes[codesize])
        continue;

      const uint fillsize = table_bits - codesize;
      const uint fillnum = 1 << fillsize;

      const uint min_code = min_codes[codesize - 1];
      const uint max_code = pTables->get_unshifted_max_code(codesize);
      const uint val_ptr = pTables->m_val_ptrs[codesize - 1];

      for (uint code = min_code; code <= max_code; code++) {
        const uint sym_index = pTables->m_sorted_symbol_order[val_ptr + code - min_code];
        CRNLIB_ASSERT(pCodesizes[sym_index] == codesize);

        for (uint j = 0; j < fillnum; j++) {
          const uint t = j + (code << fillsize);

          CRNLIB_ASSERT(t < (1U << table_bits));

          CRNLIB_ASSERT(pTables->m_lookup[t] == cUINT32_MAX);

          pTables->m_lookup[t] = sym_index | (codesize << 16U);
        }
      }
    }
  }

  for (uint i = 0; i < cMaxExpectedCodeSize; i++)
    pTables->m_val_ptrs[i] -= min_codes[i];

  pTables->m_table_max_code = 0;
  pTables->m_decode_start_code_size = pTables->m_min_code_size;

  if (table_bits) {
    uint i;
    for (i = table_bits; i >= 1; i--) {
      if (num_codes[i]) {
        pTables->m_table_max_code = pTables->m_max_codes[i - 1];
        break;
      }
    }
    if (i >= 1) {
      pTables->m_decode_start_code_size = table_bits + 1;
      for (uint i = table_bits + 1; i <= max_code_size; i++) {
        if (num_codes[i]) {
          pTables->m_decode_start_code_size = i;
          break;
        }
      }
    }
  }

  // sentinels
  pTables->m_max_codes[cMaxExpectedCodeSize] = UINT_MAX;
  pTables->m_val_ptrs[cMaxExpectedCodeSize] = 0xFFFFF;

  pTables->m_table_shift = 32 - pTables->m_table_bits;

  return true;
}